

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# named_tuple_demo.cpp
# Opt level: O3

int main(void)

{
  long *plVar1;
  ostream *poVar2;
  
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,1);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  poVar2 = std::ostream::_M_insert<double>(2.700000047683716);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return 0;
}

Assistant:

int main() {
  Customer customer(1, 2.7F);

  // Access tuple elements through their name (type)
  // Element name resolution is done at compile-time. The naming of the tuple
  // elements is essentially free
  std::cout << customer.get<CustomerId>() << std::endl;
  std::cout << customer.get<Balance>() << std::endl;

  return EXIT_SUCCESS;
}